

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

int convert_code_r(compiler_state_t *cstate,conv_state_t *conv_state,icode *ic,block *p)

{
  slist *psVar1;
  slist *psVar2;
  block *pbVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  u_int uVar7;
  void *__ptr;
  ulong uVar8;
  uint uVar9;
  slist **ppsVar10;
  uint uVar11;
  ulong __nmemb;
  slist **ppsVar12;
  bpf_insn *local_60;
  
  if (p == (block *)0x0) {
    return 1;
  }
  if (p->mark == ic->cur_mark) {
    return 1;
  }
  p->mark = ic->cur_mark;
  iVar6 = convert_code_r(cstate,conv_state,ic,(p->ef).succ);
  if (iVar6 == 0) {
    return 0;
  }
  iVar6 = convert_code_r(cstate,conv_state,ic,(p->et).succ);
  if (iVar6 != 0) {
    uVar7 = slength(p->stmts);
    local_60 = conv_state->ftail + -(ulong)(p->longjt + uVar7 + p->longjf + 1);
    conv_state->ftail = local_60;
    p->offset = (int)((ulong)((long)local_60 - (long)conv_state->fstart) >> 3);
    if (uVar7 == 0) {
      __nmemb = 0;
      __ptr = (void *)0x0;
    }
    else {
      __nmemb = (ulong)uVar7;
      __ptr = calloc(__nmemb,8);
      if (__ptr == (void *)0x0) {
        bpf_error(cstate,"not enough core");
      }
    }
    uVar8 = 0;
    ppsVar12 = &p->stmts;
    ppsVar10 = ppsVar12;
    while ((uVar8 < __nmemb && (psVar1 = *ppsVar10, psVar1 != (slist *)0x0))) {
      *(slist **)((long)__ptr + uVar8 * 8) = psVar1;
      uVar8 = uVar8 + 1;
      ppsVar10 = &psVar1->next;
    }
    uVar11 = 0;
    do {
      psVar1 = *ppsVar12;
      if (psVar1 == (slist *)0x0) {
        free(__ptr);
        local_60->code = (u_short)(p->s).code;
        local_60->k = (p->s).k;
        pbVar3 = (p->et).succ;
        if (pbVar3 == (block *)0x0) {
          return 1;
        }
        uVar11 = ~(p->offset + uVar7);
        uVar9 = pbVar3->offset + uVar11;
        if (uVar9 < 0x100) {
          local_60->jt = (u_char)uVar9;
          iVar6 = 0;
        }
        else {
          if (p->longjt == 0) {
            p->longjt = 1;
            return 0;
          }
          local_60->jt = '\0';
          local_60[1].code = 5;
          local_60[1].k = uVar9 - 1;
          iVar6 = 1;
        }
        uVar11 = uVar11 + ((p->ef).succ)->offset;
        if (0xff < uVar11) {
          if (p->longjf == 0) {
            p->longjf = 1;
            return 0;
          }
          local_60->jf = (u_char)iVar6;
          uVar9 = iVar6 + 1;
          local_60[uVar9].code = 5;
          local_60[uVar9].k = uVar11 - uVar9;
          return 1;
        }
        local_60->jf = (u_char)uVar11;
        return 1;
      }
      uVar9 = (psVar1->s).code;
      if (uVar9 != 0xffffffff) {
        local_60->code = (u_short)uVar9;
        local_60->k = (psVar1->s).k;
        if ((uVar11 != uVar7 - 2 && uVar9 != 5) && (uVar9 & 7) == 5) {
          if (((psVar1->s).jt == (slist *)0x0) || ((psVar1->s).jf == (slist *)0x0)) {
            bpf_error(cstate,"%s for block-local relative jump: off=%d","no jmp destination",
                      (ulong)uVar11);
          }
          bVar4 = false;
          bVar5 = false;
          for (uVar8 = 0; __nmemb != uVar8; uVar8 = uVar8 + 1) {
            psVar2 = *(slist **)((long)__ptr + uVar8 * 8);
            if (psVar2 == (psVar1->s).jt) {
              if (bVar4) {
                bpf_error(cstate,"%s for block-local relative jump: off=%d","multiple matches",
                          (ulong)uVar11);
              }
              local_60->jt = ~(byte)uVar11 + (char)uVar8;
              bVar4 = true;
            }
            if (psVar2 == (psVar1->s).jf) {
              if (bVar5) {
                bpf_error(cstate,"%s for block-local relative jump: off=%d","multiple matches",
                          (ulong)uVar11);
              }
              local_60->jf = ~(byte)uVar11 + (char)uVar8;
              bVar5 = true;
            }
          }
          if (!bVar4 || !bVar5) {
            bpf_error(cstate,"%s for block-local relative jump: off=%d","no destination found",
                      (ulong)uVar11);
          }
        }
        local_60 = local_60 + 1;
        uVar11 = uVar11 + 1;
      }
      ppsVar12 = &psVar1->next;
    } while( true );
  }
  return 0;
}

Assistant:

static int
convert_code_r(compiler_state_t *cstate, conv_state_t *conv_state,
    struct icode *ic, struct block *p)
{
	struct bpf_insn *dst;
	struct slist *src;
	u_int slen;
	u_int off;
	int extrajmps;		/* number of extra jumps inserted */
	struct slist **offset = NULL;

	if (p == 0 || isMarked(ic, p))
		return (1);
	Mark(ic, p);

	if (convert_code_r(cstate, conv_state, ic, JF(p)) == 0)
		return (0);
	if (convert_code_r(cstate, conv_state, ic, JT(p)) == 0)
		return (0);

	slen = slength(p->stmts);
	dst = conv_state->ftail -= (slen + 1 + p->longjt + p->longjf);
		/* inflate length by any extra jumps */

	p->offset = (int)(dst - conv_state->fstart);

	/* generate offset[] for convenience  */
	if (slen) {
		offset = (struct slist **)calloc(slen, sizeof(struct slist *));
		if (!offset) {
			bpf_error(cstate, "not enough core");
			/*NOTREACHED*/
		}
	}
	src = p->stmts;
	for (off = 0; off < slen && src; off++) {
#if 0
		printf("off=%d src=%x\n", off, src);
#endif
		offset[off] = src;
		src = src->next;
	}

	off = 0;
	for (src = p->stmts; src; src = src->next) {
		if (src->s.code == NOP)
			continue;
		dst->code = (u_short)src->s.code;
		dst->k = src->s.k;

		/* fill block-local relative jump */
		if (BPF_CLASS(src->s.code) != BPF_JMP || src->s.code == (BPF_JMP|BPF_JA)) {
#if 0
			if (src->s.jt || src->s.jf) {
				bpf_error(cstate, "illegal jmp destination");
				/*NOTREACHED*/
			}
#endif
			goto filled;
		}
		if (off == slen - 2)	/*???*/
			goto filled;

	    {
		u_int i;
		int jt, jf;
		const char *ljerr = "%s for block-local relative jump: off=%d";

#if 0
		printf("code=%x off=%d %x %x\n", src->s.code,
			off, src->s.jt, src->s.jf);
#endif

		if (!src->s.jt || !src->s.jf) {
			bpf_error(cstate, ljerr, "no jmp destination", off);
			/*NOTREACHED*/
		}

		jt = jf = 0;
		for (i = 0; i < slen; i++) {
			if (offset[i] == src->s.jt) {
				if (jt) {
					bpf_error(cstate, ljerr, "multiple matches", off);
					/*NOTREACHED*/
				}

				dst->jt = i - off - 1;
				jt++;
			}
			if (offset[i] == src->s.jf) {
				if (jf) {
					bpf_error(cstate, ljerr, "multiple matches", off);
					/*NOTREACHED*/
				}
				dst->jf = i - off - 1;
				jf++;
			}
		}
		if (!jt || !jf) {
			bpf_error(cstate, ljerr, "no destination found", off);
			/*NOTREACHED*/
		}
	    }
filled:
		++dst;
		++off;
	}
	if (offset)
		free(offset);

#ifdef BDEBUG
	bids[dst - conv_state->fstart] = p->id + 1;
#endif
	dst->code = (u_short)p->s.code;
	dst->k = p->s.k;
	if (JT(p)) {
		extrajmps = 0;
		off = JT(p)->offset - (p->offset + slen) - 1;
		if (off >= 256) {
		    /* offset too large for branch, must add a jump */
		    if (p->longjt == 0) {
		    	/* mark this instruction and retry */
			p->longjt++;
			return(0);
		    }
		    /* branch if T to following jump */
		    dst->jt = extrajmps;
		    extrajmps++;
		    dst[extrajmps].code = BPF_JMP|BPF_JA;
		    dst[extrajmps].k = off - extrajmps;
		}
		else
		    dst->jt = off;
		off = JF(p)->offset - (p->offset + slen) - 1;
		if (off >= 256) {
		    /* offset too large for branch, must add a jump */
		    if (p->longjf == 0) {
		    	/* mark this instruction and retry */
			p->longjf++;
			return(0);
		    }
		    /* branch if F to following jump */
		    /* if two jumps are inserted, F goes to second one */
		    dst->jf = extrajmps;
		    extrajmps++;
		    dst[extrajmps].code = BPF_JMP|BPF_JA;
		    dst[extrajmps].k = off - extrajmps;
		}
		else
		    dst->jf = off;
	}
	return (1);
}